

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vdrawhelper.cpp
# Opt level: O1

void fetch_linear_gradient(uint32_t *buffer,Operator *op,VSpanData *data,int y,int x,int length)

{
  uint32_t *puVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  Spread SVar10;
  uint32_t *puVar11;
  bool bVar12;
  uint32_t uVar13;
  int fixed_pos;
  uint uVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  
  fVar16 = (op->field_4).linear.l;
  fVar18 = 0.0;
  if ((fVar16 != 0.0) || (NAN(fVar16))) {
    uVar2 = data->m21;
    uVar6 = data->m22;
    uVar3 = data->m11;
    uVar7 = data->m12;
    uVar4 = data->dx;
    uVar8 = data->dy;
    fVar15 = (float)uVar4 + ((float)y + 0.5) * (float)uVar2 + ((float)x + 0.5) * (float)uVar3;
    fVar17 = (float)uVar8 + ((float)y + 0.5) * (float)uVar6 + ((float)x + 0.5) * (float)uVar7;
    fVar16 = (op->field_4).linear.dx;
    fVar18 = (op->field_4).linear.dy;
    if ((data->m13 != 0.0) || (NAN(data->m13))) {
      bVar12 = false;
    }
    else {
      bVar12 = data->m23 == 0.0;
    }
    fVar19 = fVar16 * fVar15 + fVar17 * fVar18 + (op->field_4).linear.off;
    fVar18 = fVar16 * (float)uVar3 + (float)uVar7 * fVar18;
    if (bVar12) {
      fVar19 = fVar19 * 1023.0;
      fVar18 = fVar18 * 1023.0;
    }
  }
  else {
    fVar15 = 0.0;
    fVar17 = 0.0;
    bVar12 = true;
    fVar19 = 0.0;
  }
  puVar1 = buffer + length;
  if (bVar12) {
    if (ABS(fVar18) < 1e-05) {
      uVar13 = gradientPixelFixed(&data->mGradient,(int)(fVar19 * 256.0));
      memfill32(buffer,uVar13,length);
      return;
    }
    fVar16 = (float)length * fVar18 + fVar19;
    if ((4194303.0 <= fVar16) || (fVar16 <= -4194304.0)) {
      if (0 < length) {
        puVar11 = (data->mGradient).mColorTable;
        SVar10 = (data->mGradient).mSpread;
        do {
          uVar14 = (uint)(fVar19 * 0.0009765625 * 1023.0 + 0.5);
          if (SVar10 == Reflect) {
            uVar14 = uVar14 & 0x7ff;
            if (0x3ff < uVar14) {
              uVar14 = uVar14 ^ 0x7ff;
            }
          }
          else if (SVar10 == Repeat) {
            uVar14 = uVar14 & 0x3ff;
          }
          else if ((int)uVar14 < 0) {
            uVar14 = 0;
          }
          else if (0x3fe < (int)uVar14) {
            uVar14 = 0x3ff;
          }
          *buffer = puVar11[(int)uVar14];
          fVar19 = fVar19 + fVar18;
          buffer = buffer + 1;
        } while (buffer < puVar1);
      }
    }
    else if (0 < length) {
      fixed_pos = (int)(fVar19 * 256.0);
      do {
        uVar13 = gradientPixelFixed(&data->mGradient,fixed_pos);
        *buffer = uVar13;
        fixed_pos = fixed_pos + (int)(fVar18 * 256.0);
        buffer = buffer + 1;
      } while (buffer < puVar1);
    }
  }
  else if (0 < length) {
    fVar16 = data->m13;
    fVar18 = ((float)y + 0.5) * data->m23 + ((float)x + 0.5) * fVar16 + data->m33;
    puVar11 = (data->mGradient).mColorTable;
    SVar10 = (data->mGradient).mSpread;
    uVar5 = data->m11;
    uVar9 = data->m12;
    do {
      uVar14 = (uint)(((fVar15 / fVar18) * (op->field_4).linear.dx +
                       (fVar17 / fVar18) * (op->field_4).linear.dy + (op->field_4).linear.off) *
                      1023.0 + 0.5);
      if (SVar10 == Reflect) {
        uVar14 = uVar14 & 0x7ff;
        if (0x3ff < uVar14) {
          uVar14 = uVar14 ^ 0x7ff;
        }
      }
      else if (SVar10 == Repeat) {
        uVar14 = uVar14 & 0x3ff;
      }
      else if ((int)uVar14 < 0) {
        uVar14 = 0;
      }
      else if (0x3fe < (int)uVar14) {
        uVar14 = 0x3ff;
      }
      *buffer = puVar11[(int)uVar14];
      fVar15 = fVar15 + (float)uVar5;
      fVar17 = fVar17 + (float)uVar9;
      fVar18 = fVar18 + fVar16;
      fVar18 = (float)((uint)fVar18 & -(uint)(fVar18 != 0.0) |
                      ~-(uint)(fVar18 != 0.0) & (uint)(fVar16 + fVar18));
      buffer = buffer + 1;
    } while (buffer < puVar1);
  }
  return;
}

Assistant:

void fetch_linear_gradient(uint32_t *buffer, const Operator *op,
                           const VSpanData *data, int y, int x, int length)
{
    float                t, inc;
    const VGradientData *gradient = &data->mGradient;

    bool  affine = true;
    float rx = 0, ry = 0;
    if (op->linear.l == 0) {
        t = inc = 0;
    } else {
        rx = data->m21 * (y + float(0.5)) + data->m11 * (x + float(0.5)) +
             data->dx;
        ry = data->m22 * (y + float(0.5)) + data->m12 * (x + float(0.5)) +
             data->dy;
        t = op->linear.dx * rx + op->linear.dy * ry + op->linear.off;
        inc = op->linear.dx * data->m11 + op->linear.dy * data->m12;
        affine = !data->m13 && !data->m23;

        if (affine) {
            t *= (VGradient::colorTableSize - 1);
            inc *= (VGradient::colorTableSize - 1);
        }
    }

    const uint32_t *end = buffer + length;
    if (affine) {
        if (inc > float(-1e-5) && inc < float(1e-5)) {
            memfill32(buffer, gradientPixelFixed(gradient, int(t * FIXPT_SIZE)),
                      length);
        } else {
            if (t + inc * length < float(INT_MAX >> (FIXPT_BITS + 1)) &&
                t + inc * length > float(INT_MIN >> (FIXPT_BITS + 1))) {
                // we can use fixed point math
                int t_fixed = int(t * FIXPT_SIZE);
                int inc_fixed = int(inc * FIXPT_SIZE);
                while (buffer < end) {
                    *buffer = gradientPixelFixed(gradient, t_fixed);
                    t_fixed += inc_fixed;
                    ++buffer;
                }
            } else {
                // we have to fall back to float math
                while (buffer < end) {
                    *buffer =
                        gradientPixel(gradient, t / VGradient::colorTableSize);
                    t += inc;
                    ++buffer;
                }
            }
        }
    } else {  // fall back to float math here as well
        float rw = data->m23 * (y + float(0.5)) + data->m13 * (x + float(0.5)) +
                   data->m33;
        while (buffer < end) {
            float xt = rx / rw;
            float yt = ry / rw;
            t = (op->linear.dx * xt + op->linear.dy * yt) + op->linear.off;

            *buffer = gradientPixel(gradient, t);
            rx += data->m11;
            ry += data->m12;
            rw += data->m13;
            if (!rw) {
                rw += data->m13;
            }
            ++buffer;
        }
    }
}